

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_auto_choose_color
               (LodePNGColorMode *mode_out,uchar *image,uint w,uint h,LodePNGColorMode *mode_in)

{
  uchar **ppuVar1;
  int iVar2;
  uint uVar3;
  LodePNGColorType LVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  LodePNGColorProfile local_450;
  
  local_450.alpha = 0;
  local_450.numcolors = 0;
  local_450.colored = 0;
  local_450.key._0_2_ = 0;
  local_450.key._2_2_ = 0;
  local_450.key_r = 0;
  local_450.key_g = 0;
  local_450.key_b = 0;
  local_450.bits = 1;
  lodepng_get_color_profile(&local_450,image,w,h,mode_in);
  mode_out->key_defined = 0;
  iVar2 = CONCAT22(local_450.key._2_2_,(undefined2)local_450.key);
  if (h * w < 0x11 && iVar2 != 0) {
    local_450.alpha = 1;
    uVar7 = 8;
    if (8 < local_450.bits) {
      uVar7 = local_450.bits;
    }
    local_450.bits = uVar7;
    iVar2 = 0;
  }
  uVar5 = (ulong)local_450.numcolors;
  uVar7 = 1;
  if ((2 < uVar5) && (uVar7 = 2, 4 < local_450.numcolors)) {
    uVar7 = (uint)(0x10 < local_450.numcolors) * 4 + 4;
  }
  if (((uVar7 < local_450.bits || local_450.colored != 0) &&
      (local_450.numcolors * 2 <= h * w && local_450.numcolors < 0x101)) && local_450.bits < 9) {
    ppuVar1 = &mode_out->palette;
    if (mode_out->palette != (uchar *)0x0) {
      free(mode_out->palette);
    }
    *ppuVar1 = (uchar *)0x0;
    mode_out->palettesize = 0;
    if (uVar5 == 0) {
      uVar3 = 0;
    }
    else {
      uVar6 = 0;
      do {
        iVar2 = (int)uVar6;
        uVar3 = lodepng_palette_add(mode_out,local_450.palette[uVar6 & 0xffffffff],
                                    local_450.palette[iVar2 + 1],local_450.palette[iVar2 + 2],
                                    local_450.palette[iVar2 + 3]);
        if (uVar3 != 0) goto LAB_00110c4f;
        uVar6 = uVar6 + 4;
      } while (uVar5 << 2 != uVar6);
      uVar3 = 0;
    }
LAB_00110c4f:
    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = uVar7;
    if (((mode_in->colortype == LCT_PALETTE) && (mode_out->palettesize <= mode_in->palettesize)) &&
       (mode_in->bitdepth == uVar7)) {
      if (*ppuVar1 != (uchar *)0x0) {
        free(*ppuVar1);
      }
      *ppuVar1 = (uchar *)0x0;
      mode_out->palettesize = 0;
      lodepng_color_mode_copy(mode_out,mode_in);
    }
  }
  else {
    bVar8 = local_450.colored != 0;
    mode_out->bitdepth = local_450.bits;
    LVar4 = bVar8 + 4 + (uint)bVar8;
    if (local_450.alpha == 0) {
      LVar4 = (uint)bVar8 * 2;
    }
    mode_out->colortype = LVar4;
    uVar3 = 0;
    if (iVar2 != 0) {
      uVar7 = ~(-1 << ((byte)local_450.bits & 0x1f));
      mode_out->key_r = local_450.key_r & uVar7;
      mode_out->key_g = local_450.key_g & uVar7;
      mode_out->key_b = local_450.key_b & uVar7;
      mode_out->key_defined = 1;
    }
  }
  return uVar3;
}

Assistant:

unsigned lodepng_auto_choose_color(LodePNGColorMode* mode_out,
	const unsigned char* image, unsigned w, unsigned h,
	const LodePNGColorMode* mode_in)
{
	LodePNGColorProfile prof;
	unsigned error = 0;
	unsigned i, n, palettebits, palette_ok;

	lodepng_color_profile_init(&prof);
	error = lodepng_get_color_profile(&prof, image, w, h, mode_in);
	if (error) return error;
	mode_out->key_defined = 0;

	if (prof.key && w * h <= 16)
	{
		prof.alpha = 1; /*too few pixels to justify tRNS chunk overhead*/
		prof.key = 0;
		if (prof.bits < 8) prof.bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
	}
	n = prof.numcolors;
	palettebits = n <= 2 ? 1 : (n <= 4 ? 2 : (n <= 16 ? 4 : 8));
	palette_ok = n <= 256 && prof.bits <= 8;
	if (w * h < n * 2) palette_ok = 0; /*don't add palette overhead if image has only a few pixels*/
	if (!prof.colored && prof.bits <= palettebits) palette_ok = 0; /*grey is less overhead*/

	if (palette_ok)
	{
		unsigned char* p = prof.palette;
		lodepng_palette_clear(mode_out); /*remove potential earlier palette*/
		for (i = 0; i != prof.numcolors; ++i)
		{
			error = lodepng_palette_add(mode_out, p[i * 4 + 0], p[i * 4 + 1], p[i * 4 + 2], p[i * 4 + 3]);
			if (error) break;
		}

		mode_out->colortype = LCT_PALETTE;
		mode_out->bitdepth = palettebits;

		if (mode_in->colortype == LCT_PALETTE && mode_in->palettesize >= mode_out->palettesize
			&& mode_in->bitdepth == mode_out->bitdepth)
		{
			/*If input should have same palette colors, keep original to preserve its order and prevent conversion*/
			lodepng_color_mode_cleanup(mode_out);
			lodepng_color_mode_copy(mode_out, mode_in);
		}
	}
	else /*8-bit or 16-bit per channel*/
	{
		mode_out->bitdepth = prof.bits;
		mode_out->colortype = prof.alpha ? (prof.colored ? LCT_RGBA : LCT_GREY_ALPHA)
			: (prof.colored ? LCT_RGB : LCT_GREY);

		if (prof.key)
		{
			unsigned mask = (1u << mode_out->bitdepth) - 1u; /*profile always uses 16-bit, mask converts it*/
			mode_out->key_r = prof.key_r & mask;
			mode_out->key_g = prof.key_g & mask;
			mode_out->key_b = prof.key_b & mask;
			mode_out->key_defined = 1;
		}
	}

	return error;
}